

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_GetV(armci_giov_t *darr,int len,int proc)

{
  int iVar1;
  comex_giov_t *b;
  int in_ESI;
  armci_giov_t *in_RDI;
  comex_giov_t *unaff_retaddr;
  comex_giov_t *adarr;
  int rc;
  
  b = (comex_giov_t *)malloc((long)in_ESI * 0x18);
  convert_giov(in_RDI,b,in_ESI);
  iVar1 = comex_getv(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  free(b);
  return iVar1;
}

Assistant:

int PARMCI_GetV(armci_giov_t *darr, int len, int proc)
{
    int rc;
    comex_giov_t *adarr = malloc(sizeof(comex_giov_t) * len);
    convert_giov(darr, adarr, len);
    rc = comex_getv(adarr, len, proc, COMEX_GROUP_WORLD);
    free(adarr);
    return rc;
}